

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btScaledBvhTriangleMeshShape.cpp
# Opt level: O1

void __thiscall
btScaledBvhTriangleMeshShape::getAabb
          (btScaledBvhTriangleMeshShape *this,btTransform *trans,btVector3 *aabbMin,
          btVector3 *aabbMax)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  btBvhTriangleMeshShape *pbVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float extraout_XMM0_Da;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  pbVar4 = this->m_bvhTriMeshShape;
  fVar15 = (this->m_localScaling).m_floats[0];
  fVar1 = (this->m_localScaling).m_floats[1];
  fVar12 = (pbVar4->super_btTriangleMeshShape).m_localAabbMin.m_floats[0] * fVar15;
  fVar10 = (pbVar4->super_btTriangleMeshShape).m_localAabbMin.m_floats[1] * fVar1;
  fVar2 = (this->m_localScaling).m_floats[2];
  fVar9 = (pbVar4->super_btTriangleMeshShape).m_localAabbMin.m_floats[2] * fVar2;
  fVar16 = (pbVar4->super_btTriangleMeshShape).m_localAabbMax.m_floats[0] * fVar15;
  fVar13 = (pbVar4->super_btTriangleMeshShape).m_localAabbMax.m_floats[1] * fVar1;
  fVar11 = (pbVar4->super_btTriangleMeshShape).m_localAabbMax.m_floats[2] * fVar2;
  fVar14 = (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar12 | -(uint)(fVar15 < 0.0) & (uint)fVar16);
  fVar7 = (float)(~-(uint)(fVar1 < 0.0) & (uint)fVar10 | -(uint)(fVar1 < 0.0) & (uint)fVar13);
  fVar8 = (float)(~-(uint)(fVar2 < 0.0) & (uint)fVar9 | -(uint)(fVar2 < 0.0) & (uint)fVar11);
  fVar15 = (float)(~-(uint)(0.0 < fVar15) & (uint)fVar12 | (uint)fVar16 & -(uint)(0.0 < fVar15));
  fVar1 = (float)(~-(uint)(0.0 < fVar1) & (uint)fVar10 | (uint)fVar13 & -(uint)(0.0 < fVar1));
  fVar2 = (float)(~-(uint)(0.0 < fVar2) & (uint)fVar9 | (uint)fVar11 & -(uint)(0.0 < fVar2));
  (*(pbVar4->super_btTriangleMeshShape).super_btConcaveShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])();
  fVar16 = (fVar15 - fVar14) * 0.5 + extraout_XMM0_Da;
  fVar17 = (fVar1 - fVar7) * 0.5 + extraout_XMM0_Da;
  fVar13 = (fVar2 - fVar8) * 0.5 + extraout_XMM0_Da;
  fVar12 = (fVar15 + fVar14) * 0.5;
  fVar18 = (fVar1 + fVar7) * 0.5;
  fVar19 = (fVar2 + fVar8) * 0.5;
  fVar14 = (trans->m_basis).m_el[0].m_floats[0];
  fVar7 = (trans->m_basis).m_el[0].m_floats[1];
  fVar8 = (trans->m_basis).m_el[0].m_floats[2];
  fVar15 = (trans->m_basis).m_el[2].m_floats[0];
  fVar1 = (trans->m_basis).m_el[2].m_floats[1];
  fVar2 = (trans->m_basis).m_el[2].m_floats[2];
  fVar10 = fVar19 * fVar2 + fVar12 * fVar15 + fVar18 * fVar1 + (trans->m_origin).m_floats[2];
  fVar9 = ABS(fVar2) * fVar13 + ABS(fVar15) * fVar16 + ABS(fVar1) * fVar17;
  fVar15 = (trans->m_basis).m_el[1].m_floats[0];
  fVar1 = (trans->m_basis).m_el[1].m_floats[1];
  fVar2 = (trans->m_basis).m_el[1].m_floats[2];
  uVar3 = *(undefined8 *)(trans->m_origin).m_floats;
  fVar11 = (float)uVar3 + fVar19 * fVar8 + fVar12 * fVar14 + fVar18 * fVar7;
  fVar12 = (float)((ulong)uVar3 >> 0x20) + fVar19 * fVar2 + fVar12 * fVar15 + fVar18 * fVar1;
  fVar14 = fVar13 * ABS(fVar8) + fVar16 * ABS(fVar14) + fVar17 * ABS(fVar7);
  fVar15 = fVar13 * ABS(fVar2) + fVar16 * ABS(fVar15) + fVar17 * ABS(fVar1);
  auVar5._4_4_ = fVar12 - fVar15;
  auVar5._0_4_ = fVar11 - fVar14;
  auVar5._8_4_ = fVar10 - fVar9;
  auVar5._12_4_ = 0;
  *(undefined1 (*) [16])aabbMin->m_floats = auVar5;
  auVar6._4_4_ = fVar15 + fVar12;
  auVar6._0_4_ = fVar14 + fVar11;
  auVar6._8_4_ = fVar9 + fVar10;
  auVar6._12_4_ = 0;
  *(undefined1 (*) [16])aabbMax->m_floats = auVar6;
  return;
}

Assistant:

void	btScaledBvhTriangleMeshShape::getAabb(const btTransform& trans,btVector3& aabbMin,btVector3& aabbMax) const
{
	btVector3 localAabbMin = m_bvhTriMeshShape->getLocalAabbMin();
	btVector3 localAabbMax = m_bvhTriMeshShape->getLocalAabbMax();

	btVector3 tmpLocalAabbMin = localAabbMin * m_localScaling;
	btVector3 tmpLocalAabbMax = localAabbMax * m_localScaling;

	localAabbMin[0] = (m_localScaling.getX() >= 0.) ? tmpLocalAabbMin[0] : tmpLocalAabbMax[0];
	localAabbMin[1] = (m_localScaling.getY() >= 0.) ? tmpLocalAabbMin[1] : tmpLocalAabbMax[1];
	localAabbMin[2] = (m_localScaling.getZ() >= 0.) ? tmpLocalAabbMin[2] : tmpLocalAabbMax[2];
	localAabbMax[0] = (m_localScaling.getX() <= 0.) ? tmpLocalAabbMin[0] : tmpLocalAabbMax[0];
	localAabbMax[1] = (m_localScaling.getY() <= 0.) ? tmpLocalAabbMin[1] : tmpLocalAabbMax[1];
	localAabbMax[2] = (m_localScaling.getZ() <= 0.) ? tmpLocalAabbMin[2] : tmpLocalAabbMax[2];

	btVector3 localHalfExtents = btScalar(0.5)*(localAabbMax-localAabbMin);
	btScalar margin = m_bvhTriMeshShape->getMargin();
	localHalfExtents += btVector3(margin,margin,margin);
	btVector3 localCenter = btScalar(0.5)*(localAabbMax+localAabbMin);
	
	btMatrix3x3 abs_b = trans.getBasis().absolute();  

	btVector3 center = trans(localCenter);

    btVector3 extent = localHalfExtents.dot3(abs_b[0], abs_b[1], abs_b[2]);
	aabbMin = center - extent;
	aabbMax = center + extent;

}